

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linux.c
# Opt level: O2

int uv_interface_addresses(uv_interface_address_t **addresses,int *count)

{
  char cVar1;
  sockaddr *psVar2;
  char *__s;
  char *__s1;
  undefined8 uVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  int *piVar7;
  uv_interface_address_t *puVar8;
  char *pcVar9;
  size_t __n;
  ifaddrs *ent;
  ifaddrs *ent_00;
  ifaddrs *ent_01;
  undefined4 uVar10;
  undefined4 uVar11;
  in_addr_t iVar12;
  undefined4 uVar13;
  ifaddrs *addrs;
  uv_interface_address_t **local_40;
  int *local_38;
  
  ent_00 = (ifaddrs *)&addrs;
  ent = (ifaddrs *)&addrs;
  ent_01 = (ifaddrs *)&addrs;
  *count = 0;
  *addresses = (uv_interface_address_t *)0x0;
  iVar4 = getifaddrs(&addrs);
  if (iVar4 == 0) {
    while (ent_00 = ent_00->ifa_next, ent_00 != (ifaddrs *)0x0) {
      iVar4 = uv__ifaddr_exclude(ent_00,1);
      if (iVar4 == 0) {
        *count = *count + 1;
      }
    }
    if ((long)*count != 0) {
      puVar8 = (uv_interface_address_t *)uv__calloc((long)*count,0x60);
      *addresses = puVar8;
      if (puVar8 == (uv_interface_address_t *)0x0) {
        freeifaddrs(addrs);
        return -0xc;
      }
      while (ent = ent->ifa_next, ent != (ifaddrs *)0x0) {
        iVar4 = uv__ifaddr_exclude(ent,1);
        if (iVar4 == 0) {
          pcVar9 = uv__strdup(ent->ifa_name);
          puVar8->name = pcVar9;
          psVar2 = ent->ifa_addr;
          if (psVar2->sa_family == 10) {
            uVar10._0_2_ = psVar2->sa_family;
            uVar10._2_1_ = psVar2->sa_data[0];
            uVar10._3_1_ = psVar2->sa_data[1];
            iVar12 = *(in_addr_t *)(psVar2->sa_data + 2);
            uVar11 = *(undefined4 *)(psVar2->sa_data + 6);
            uVar13 = *(undefined4 *)(psVar2->sa_data + 10);
            uVar3 = *(undefined8 *)(psVar2[1].sa_data + 2);
            *(undefined8 *)((long)&puVar8->address + 0xc) = *(undefined8 *)(psVar2->sa_data + 10);
            *(undefined8 *)((long)&puVar8->address + 0x14) = uVar3;
          }
          else {
            uVar10._0_2_ = psVar2->sa_family;
            uVar10._2_1_ = psVar2->sa_data[0];
            uVar10._3_1_ = psVar2->sa_data[1];
            iVar12 = *(in_addr_t *)(psVar2->sa_data + 2);
            uVar11 = *(undefined4 *)(psVar2->sa_data + 6);
            uVar13 = *(undefined4 *)(psVar2->sa_data + 10);
          }
          *(undefined4 *)&puVar8->address = uVar10;
          (puVar8->address).address4.sin_addr.s_addr = iVar12;
          *(undefined4 *)((long)&puVar8->address + 8) = uVar11;
          *(undefined4 *)((long)&puVar8->address + 0xc) = uVar13;
          psVar2 = ent->ifa_netmask;
          if (psVar2->sa_family == 10) {
            uVar11._0_2_ = psVar2->sa_family;
            uVar11._2_1_ = psVar2->sa_data[0];
            uVar11._3_1_ = psVar2->sa_data[1];
            iVar12 = *(in_addr_t *)(psVar2->sa_data + 2);
            uVar10 = *(undefined4 *)(psVar2->sa_data + 6);
            uVar13 = *(undefined4 *)(psVar2->sa_data + 10);
            uVar3 = *(undefined8 *)(psVar2[1].sa_data + 2);
            *(undefined8 *)((long)&puVar8->netmask + 0xc) = *(undefined8 *)(psVar2->sa_data + 10);
            *(undefined8 *)((long)&puVar8->netmask + 0x14) = uVar3;
          }
          else {
            uVar11._0_2_ = psVar2->sa_family;
            uVar11._2_1_ = psVar2->sa_data[0];
            uVar11._3_1_ = psVar2->sa_data[1];
            iVar12 = *(in_addr_t *)(psVar2->sa_data + 2);
            uVar10 = *(undefined4 *)(psVar2->sa_data + 6);
            uVar13 = *(undefined4 *)(psVar2->sa_data + 10);
          }
          *(undefined4 *)&puVar8->netmask = uVar11;
          (puVar8->netmask).netmask4.sin_addr.s_addr = iVar12;
          *(undefined4 *)((long)&puVar8->netmask + 8) = uVar10;
          *(undefined4 *)((long)&puVar8->netmask + 0xc) = uVar13;
          uVar5 = ent->ifa_flags;
          if ((((uVar5 & 2) != 0) &&
              (psVar2 = (ent->ifa_ifu).ifu_broadaddr, psVar2 != (sockaddr *)0x0)) &&
             (psVar2->sa_family == 2)) {
            uVar3 = *(undefined8 *)(psVar2->sa_data + 6);
            *(undefined8 *)&puVar8->broadcast = *(undefined8 *)psVar2;
            *(undefined8 *)((long)&puVar8->broadcast + 8) = uVar3;
            uVar5 = ent->ifa_flags;
          }
          puVar8->is_internal = uVar5 >> 3 & 1;
          puVar8 = puVar8 + 1;
        }
      }
      local_40 = addresses;
      local_38 = count;
      while (ent_01 = ent_01->ifa_next, ent_01 != (ifaddrs *)0x0) {
        iVar4 = uv__ifaddr_exclude(ent_01,0);
        if (iVar4 == 0) {
          pcVar9 = (*addresses)->phys_addr;
          for (iVar4 = 0; addresses = local_40, iVar4 < *count; iVar4 = iVar4 + 1) {
            __s = ent_01->ifa_name;
            __n = strlen(__s);
            __s1 = ((uv_interface_address_t *)(pcVar9 + -8))->name;
            iVar6 = strncmp(__s1,__s,__n);
            if ((iVar6 == 0) && ((cVar1 = __s1[__n], cVar1 == ':' || (cVar1 == '\0')))) {
              psVar2 = ent_01->ifa_addr;
              *(sa_family_t *)(pcVar9 + 4) = psVar2[1].sa_family;
              *(undefined4 *)pcVar9 = *(undefined4 *)(psVar2->sa_data + 10);
            }
            pcVar9 = pcVar9 + 0x60;
            count = local_38;
          }
        }
      }
    }
    freeifaddrs(addrs);
    iVar4 = 0;
  }
  else {
    piVar7 = __errno_location();
    iVar4 = -*piVar7;
  }
  return iVar4;
}

Assistant:

int uv_interface_addresses(uv_interface_address_t** addresses, int* count) {
  struct ifaddrs *addrs, *ent;
  uv_interface_address_t* address;
  int i;
  struct sockaddr_ll *sll;

  *count = 0;
  *addresses = NULL;

  if (getifaddrs(&addrs))
    return UV__ERR(errno);

  /* Count the number of interfaces */
  for (ent = addrs; ent != NULL; ent = ent->ifa_next) {
    if (uv__ifaddr_exclude(ent, UV__EXCLUDE_IFADDR))
      continue;

    (*count)++;
  }

  if (*count == 0) {
    freeifaddrs(addrs);
    return 0;
  }

  /* Make sure the memory is initiallized to zero using calloc() */
  *addresses = uv__calloc(*count, sizeof(**addresses));
  if (!(*addresses)) {
    freeifaddrs(addrs);
    return UV_ENOMEM;
  }

  address = *addresses;

  for (ent = addrs; ent != NULL; ent = ent->ifa_next) {
    if (uv__ifaddr_exclude(ent, UV__EXCLUDE_IFADDR))
      continue;

    address->name = uv__strdup(ent->ifa_name);

    if (ent->ifa_addr->sa_family == AF_INET6) {
      address->address.address6 = *((struct sockaddr_in6*) ent->ifa_addr);
    } else {
      address->address.address4 = *((struct sockaddr_in*) ent->ifa_addr);
    }

    if (ent->ifa_netmask->sa_family == AF_INET6) {
      address->netmask.netmask6 = *((struct sockaddr_in6*) ent->ifa_netmask);
    } else {
      address->netmask.netmask4 = *((struct sockaddr_in*) ent->ifa_netmask);
    }

    if (ent->ifa_flags & IFF_BROADCAST && ent->ifa_broadaddr != NULL) {
      if (ent->ifa_broadaddr->sa_family == AF_INET)
        address->broadcast.broadcast4 = *((struct sockaddr_in*) ent->ifa_broadaddr);
    }

    address->is_internal = !!(ent->ifa_flags & IFF_LOOPBACK);

    address++;
  }

  /* Fill in physical addresses for each interface */
  for (ent = addrs; ent != NULL; ent = ent->ifa_next) {
    if (uv__ifaddr_exclude(ent, UV__EXCLUDE_IFPHYS))
      continue;

    address = *addresses;

    for (i = 0; i < (*count); i++) {
      size_t namelen = strlen(ent->ifa_name);
      /* Alias interface share the same physical address */
      if (strncmp(address->name, ent->ifa_name, namelen) == 0 &&
          (address->name[namelen] == 0 || address->name[namelen] == ':')) {
        sll = (struct sockaddr_ll*)ent->ifa_addr;
        memcpy(address->phys_addr, sll->sll_addr, sizeof(address->phys_addr));
      }
      address++;
    }
  }

  freeifaddrs(addrs);

  return 0;
}